

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O3

void __thiscall
t_cpp_generator::generate_service_async_skeleton(t_cpp_generator *this,t_service *tservice)

{
  int *piVar1;
  long lVar2;
  t_function *ptVar3;
  t_type *type;
  int iVar4;
  undefined4 extraout_var;
  long *plVar5;
  ostream *poVar6;
  _func_int **pp_Var7;
  long *plVar8;
  char *pcVar9;
  t_cpp_generator *this_00;
  char *pcVar10;
  pointer pptVar11;
  string target;
  string svcname;
  t_field returnfield;
  string f_skeleton_name;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  string ns;
  ofstream_with_content_based_conditional_update f_skeleton;
  string local_518;
  string local_4f8;
  char *local_4d8;
  long local_4d0;
  char local_4c8 [16];
  string local_4b8;
  t_field local_498;
  long *local_3e8;
  long local_3e0;
  long local_3d8;
  long lStack_3d0;
  string local_3c8;
  vector<t_function_*,_std::allocator<t_function_*>_> local_3a8;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  undefined1 local_1d0 [16];
  _func_int *local_1c0;
  long lStack_1b8;
  string local_160 [32];
  undefined1 local_140;
  ios_base local_138 [264];
  
  iVar4 = (*(tservice->super_t_type).super_t_doc._vptr_t_doc[3])(tservice);
  local_4d8 = local_4c8;
  lVar2 = *(long *)CONCAT44(extraout_var,iVar4);
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_4d8,lVar2,((long *)CONCAT44(extraout_var,iVar4))[1] + lVar2);
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(&local_498,this);
  plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_498,(ulong)local_4d8);
  pp_Var7 = (_func_int **)(plVar5 + 2);
  if ((_func_int **)*plVar5 == pp_Var7) {
    local_1c0 = *pp_Var7;
    lStack_1b8 = plVar5[3];
    local_1d0._0_8_ = &local_1c0;
  }
  else {
    local_1c0 = *pp_Var7;
    local_1d0._0_8_ = (_func_int **)*plVar5;
  }
  local_1d0._8_8_ = plVar5[1];
  *plVar5 = (long)pp_Var7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append(local_1d0);
  local_3e8 = &local_3d8;
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_3d8 = *plVar8;
    lStack_3d0 = plVar5[3];
  }
  else {
    local_3d8 = *plVar8;
    local_3e8 = (long *)*plVar5;
  }
  local_3e0 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if ((_func_int **)local_1d0._0_8_ != &local_1c0) {
    operator_delete((void *)local_1d0._0_8_);
  }
  if (local_498.super_t_doc._vptr_t_doc !=
      (_func_int **)&local_498.super_t_doc.doc_._M_string_length) {
    operator_delete(local_498.super_t_doc._vptr_t_doc);
  }
  this_00 = (t_cpp_generator *)(tservice->super_t_type).program_;
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"cpp","");
  t_program::get_namespace(&local_1f0,(t_program *)this_00,&local_210);
  namespace_prefix(&local_290,this_00,&local_1f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p);
  }
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  template_ofstream_with_content_based_conditional_update
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_1d0);
  std::__cxx11::string::string((string *)&local_498,(char *)local_3e8,(allocator *)&local_518);
  std::__cxx11::string::_M_assign(local_160);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::clear_buf
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_1d0);
  local_140 = 0;
  if (local_498.super_t_doc._vptr_t_doc !=
      (_func_int **)&local_498.super_t_doc.doc_._M_string_length) {
    operator_delete(local_498.super_t_doc._vptr_t_doc);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1d0,
             "// This autogenerated skeleton file illustrates one way to adapt a synchronous",0x4e);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1d0,::endl_abi_cxx11_._M_dataplus._M_p,
                      ::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,"// interface into an asynchronous interface. You should copy it to another",
             0x4a);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,"// filename to avoid overwriting it and rewrite as asynchronous any functions",
             0x4d);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,"// that would otherwise introduce unwanted latency.",0x33);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"#include \"",10);
  get_include_prefix_abi_cxx11_
            ((string *)&local_498,this,(this->super_t_oop_generator).super_t_generator.program_);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,(char *)local_498.super_t_doc._vptr_t_doc,
                      (long)local_498.super_t_doc.doc_._M_dataplus._M_p);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_4d8,local_4d0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,".h\"",3);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,"#include <thrift/protocol/TBinaryProtocol.h>",0x2c);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,"#include <thrift/async/TAsyncProtocolProcessor.h>",0x31);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,"#include <thrift/async/TEvhttpServer.h>",0x27);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"#include <event.h>",0x12);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"#include <evhttp.h>",0x13);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,"using namespace ::apache::thrift;",0x21);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,"using namespace ::apache::thrift::protocol;",0x2b);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,"using namespace ::apache::thrift::transport;",0x2c);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,"using namespace ::apache::thrift::async;",0x28);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if (local_498.super_t_doc._vptr_t_doc !=
      (_func_int **)&local_498.super_t_doc.doc_._M_string_length) {
    operator_delete(local_498.super_t_doc._vptr_t_doc);
  }
  if ((local_290._M_string_length != 0) &&
     (iVar4 = std::__cxx11::string::compare((char *)&local_290), iVar4 != 0)) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d0,"using namespace ",0x10)
    ;
    std::__cxx11::string::string
              ((string *)&local_498,(string *)&local_290,0,local_290._M_string_length - 2);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1d0,(char *)local_498.super_t_doc._vptr_t_doc,
                        (long)local_498.super_t_doc.doc_._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,";",1);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if (local_498.super_t_doc._vptr_t_doc !=
        (_func_int **)&local_498.super_t_doc.doc_._M_string_length) {
      operator_delete(local_498.super_t_doc._vptr_t_doc);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d0,"class ",6);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1d0,local_4d8,local_4d0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"Handler : virtual public ",0x19);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_4d8,local_4d0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"If {",4);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," public:",8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_((string *)&local_498,(t_generator *)this);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1d0,(char *)local_498.super_t_doc._vptr_t_doc,
                      (long)local_498.super_t_doc.doc_._M_dataplus._M_p);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_4d8,local_4d0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"Handler() {",0xb);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_518,(t_generator *)this);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,local_518._M_dataplus._M_p,local_518._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,"  // Your initialization goes here",0x22);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_4f8,(t_generator *)this);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,local_4f8._M_dataplus._M_p,local_4f8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"}",1);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
    operator_delete(local_4f8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_518._M_dataplus._M_p != &local_518.field_2) {
    operator_delete(local_518._M_dataplus._M_p);
  }
  if (local_498.super_t_doc._vptr_t_doc !=
      (_func_int **)&local_498.super_t_doc.doc_._M_string_length) {
    operator_delete(local_498.super_t_doc._vptr_t_doc);
  }
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector(&local_3a8,&tservice->functions_)
  ;
  pptVar11 = local_3a8.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (local_3a8.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_3a8.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x23])
                (this,(ostream *)local_1d0,*pptVar11);
      t_generator::indent_abi_cxx11_((string *)&local_498,(t_generator *)this);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1d0,(char *)local_498.super_t_doc._vptr_t_doc,
                          (long)local_498.super_t_doc.doc_._M_dataplus._M_p);
      ptVar3 = *pptVar11;
      local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"","");
      local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"","");
      function_signature(&local_518,this,ptVar3,&local_330,&local_2b0,true);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,local_518._M_dataplus._M_p,local_518._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," {",2);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_4f8,(t_generator *)this);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,local_4f8._M_dataplus._M_p,local_4f8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,"  // Your implementation goes here",0x22);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_4b8,(t_generator *)this);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,local_4b8._M_dataplus._M_p,local_4b8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"  printf(\"",10);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,((*pptVar11)->name_)._M_dataplus._M_p,
                          ((*pptVar11)->name_)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\\n\");",5);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_3c8,(t_generator *)this);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,local_3c8._M_dataplus._M_p,local_3c8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"}",1);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
        operator_delete(local_3c8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
        operator_delete(local_4b8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
        operator_delete(local_4f8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_518._M_dataplus._M_p != &local_518.field_2) {
        operator_delete(local_518._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
        operator_delete(local_2b0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_330._M_dataplus._M_p != &local_330.field_2) {
        operator_delete(local_330._M_dataplus._M_p);
      }
      if (local_498.super_t_doc._vptr_t_doc !=
          (_func_int **)&local_498.super_t_doc.doc_._M_string_length) {
        operator_delete(local_498.super_t_doc._vptr_t_doc);
      }
      pptVar11 = pptVar11 + 1;
    } while (pptVar11 !=
             local_3a8.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d0,"};",2);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1d0,::endl_abi_cxx11_._M_dataplus._M_p,
                      ::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d0,"class ",6);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1d0,local_4d8,local_4d0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"AsyncHandler : ",0xf);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"public ",7);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_4d8,local_4d0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"CobSvIf {",9);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," public:",8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_((string *)&local_498,(t_generator *)this);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1d0,(char *)local_498.super_t_doc._vptr_t_doc,
                      (long)local_498.super_t_doc.doc_._M_dataplus._M_p);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_4d8,local_4d0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"AsyncHandler() {",0x10);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_518,(t_generator *)this);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,local_518._M_dataplus._M_p,local_518._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,"  syncHandler_ = std::unique_ptr<",0x21);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_4d8,local_4d0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"Handler>(new ",0xd);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_4d8,local_4d0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"Handler);",9);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_4f8,(t_generator *)this);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,local_4f8._M_dataplus._M_p,local_4f8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,"  // Your initialization goes here",0x22);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_4b8,(t_generator *)this);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,local_4b8._M_dataplus._M_p,local_4b8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"}",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
    operator_delete(local_4b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
    operator_delete(local_4f8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_518._M_dataplus._M_p != &local_518.field_2) {
    operator_delete(local_518._M_dataplus._M_p);
  }
  if (local_498.super_t_doc._vptr_t_doc !=
      (_func_int **)&local_498.super_t_doc.doc_._M_string_length) {
    operator_delete(local_498.super_t_doc._vptr_t_doc);
  }
  t_generator::indent_abi_cxx11_((string *)&local_498,(t_generator *)this);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1d0,(char *)local_498.super_t_doc._vptr_t_doc,
                      (long)local_498.super_t_doc.doc_._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"virtual ~",9);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,(this->super_t_oop_generator).super_t_generator.service_name_.
                             _M_dataplus._M_p,
                      (this->super_t_oop_generator).super_t_generator.service_name_._M_string_length
                     );
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"AsyncHandler();",0xf);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if (local_498.super_t_doc._vptr_t_doc !=
      (_func_int **)&local_498.super_t_doc.doc_._M_string_length) {
    operator_delete(local_498.super_t_doc._vptr_t_doc);
  }
  if (local_3a8.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_3a8.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pptVar11 = local_3a8.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    do {
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1d0,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_((string *)&local_498,(t_generator *)this);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,(char *)local_498.super_t_doc._vptr_t_doc,
                          (long)local_498.super_t_doc.doc_._M_dataplus._M_p);
      ptVar3 = *pptVar11;
      local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_350,"CobSv","");
      local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"");
      function_signature(&local_518,this,ptVar3,&local_350,&local_2d0,true);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,local_518._M_dataplus._M_p,local_518._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," {",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_518._M_dataplus._M_p != &local_518.field_2) {
        operator_delete(local_518._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
        operator_delete(local_2d0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_350._M_dataplus._M_p != &local_350.field_2) {
        operator_delete(local_350._M_dataplus._M_p);
      }
      if (local_498.super_t_doc._vptr_t_doc !=
          (_func_int **)&local_498.super_t_doc.doc_._M_string_length) {
        operator_delete(local_498.super_t_doc._vptr_t_doc);
      }
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + 1;
      type = (*pptVar11)->returntype_;
      local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"_return","");
      t_field::t_field(&local_498,type,&local_2f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
        operator_delete(local_2f0._M_dataplus._M_p);
      }
      iVar4 = (*(type->super_t_doc)._vptr_t_doc[4])(type);
      pcVar10 = "_return";
      if ((char)iVar4 != '\0') {
        pcVar10 = "";
      }
      local_518._M_dataplus._M_p = (pointer)&local_518.field_2;
      pcVar9 = pcVar10 + 7;
      if ((char)iVar4 != '\0') {
        pcVar9 = pcVar10;
      }
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_518,pcVar10,pcVar9);
      iVar4 = (*(type->super_t_doc)._vptr_t_doc[4])(type);
      if ((char)iVar4 == '\0') {
        t_generator::indent_abi_cxx11_(&local_4f8,(t_generator *)this);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1d0,local_4f8._M_dataplus._M_p,
                            local_4f8._M_string_length);
        declare_field_abi_cxx11_(&local_4b8,this,&local_498,true,false,false,false);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,local_4b8._M_dataplus._M_p,local_4b8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
          operator_delete(local_4b8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
          operator_delete(local_4f8._M_dataplus._M_p);
        }
      }
      ptVar3 = *pptVar11;
      local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_370,local_518._M_dataplus._M_p,
                 local_518._M_dataplus._M_p + local_518._M_string_length);
      local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,"syncHandler_","");
      local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"");
      generate_function_call(this,(ostream *)local_1d0,ptVar3,&local_370,&local_390,&local_310);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_310._M_dataplus._M_p != &local_310.field_2) {
        operator_delete(local_310._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_390._M_dataplus._M_p != &local_390.field_2) {
        operator_delete(local_390._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_370._M_dataplus._M_p != &local_370.field_2) {
        operator_delete(local_370._M_dataplus._M_p);
      }
      t_generator::indent_abi_cxx11_(&local_4f8,(t_generator *)this);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1d0,local_4f8._M_dataplus._M_p,local_4f8._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"return cob(",0xb);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,local_518._M_dataplus._M_p,local_518._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,");",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
        operator_delete(local_4f8._M_dataplus._M_p);
      }
      t_oop_generator::scope_down(&this->super_t_oop_generator,(ostream *)local_1d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_518._M_dataplus._M_p != &local_518.field_2) {
        operator_delete(local_518._M_dataplus._M_p);
      }
      t_field::~t_field(&local_498);
      pptVar11 = pptVar11 + 1;
    } while (pptVar11 !=
             local_3a8.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1d0,::endl_abi_cxx11_._M_dataplus._M_p,
                      ::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," protected:",0xb);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_((string *)&local_498,(t_generator *)this);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,(char *)local_498.super_t_doc._vptr_t_doc,
                      (long)local_498.super_t_doc.doc_._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"std::unique_ptr<",0x10);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_4d8,local_4d0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"Handler> syncHandler_;",0x16);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if (local_498.super_t_doc._vptr_t_doc !=
      (_func_int **)&local_498.super_t_doc.doc_._M_string_length) {
    operator_delete(local_498.super_t_doc._vptr_t_doc);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d0,"};",2);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1d0,::endl_abi_cxx11_._M_dataplus._M_p,
                      ::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_((string *)&local_498,(t_generator *)this);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1d0,(char *)local_498.super_t_doc._vptr_t_doc,
                      (long)local_498.super_t_doc.doc_._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,"int main(int argc, char **argv) {",0x21);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if (local_498.super_t_doc._vptr_t_doc !=
      (_func_int **)&local_498.super_t_doc.doc_._M_string_length) {
    operator_delete(local_498.super_t_doc._vptr_t_doc);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_((string *)&local_498,(t_generator *)this);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1d0,(char *)local_498.super_t_doc._vptr_t_doc,
                      (long)local_498.super_t_doc.doc_._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"int port = 9090;",0x10);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_518,(t_generator *)this);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,local_518._M_dataplus._M_p,local_518._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"::std::shared_ptr<",0x12);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_4d8,local_4d0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"AsyncHandler> handler(new ",0x1a);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_4d8,local_4d0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"AsyncHandler());",0x10);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_4f8,(t_generator *)this);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,local_4f8._M_dataplus._M_p,local_4f8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"::std::shared_ptr<",0x12);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_4d8,local_4d0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"AsyncProcessor> processor(new ",0x1e);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_4d8,local_4d0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"AsyncProcessor(handler));",0x19);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_4b8,(t_generator *)this);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,local_4b8._M_dataplus._M_p,local_4b8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,
             "::std::shared_ptr<TProtocolFactory> protocolFactory(new TBinaryProtocolFactory());",
             0x52);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_3c8,(t_generator *)this);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,local_3c8._M_dataplus._M_p,local_3c8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,
             "::std::shared_ptr<TAsyncProtocolProcessor> protocolProcessor(new TAsyncProtocolProcessor(processor, protocolFactory));"
             ,0x76);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_230,(t_generator *)this);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,local_230._M_dataplus._M_p,local_230._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,"TEvhttpServer server(protocolProcessor, port);",0x2e);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_250,(t_generator *)this);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,local_250._M_dataplus._M_p,local_250._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"server.serve();",0xf);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_270,(t_generator *)this);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,local_270._M_dataplus._M_p,local_270._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"return 0;",9);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
    operator_delete(local_3c8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
    operator_delete(local_4b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
    operator_delete(local_4f8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_518._M_dataplus._M_p != &local_518.field_2) {
    operator_delete(local_518._M_dataplus._M_p);
  }
  if (local_498.super_t_doc._vptr_t_doc !=
      (_func_int **)&local_498.super_t_doc.doc_._M_string_length) {
    operator_delete(local_498.super_t_doc._vptr_t_doc);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d0,"}",1);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1d0,::endl_abi_cxx11_._M_dataplus._M_p,
                      ::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if (local_3a8.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3a8.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  ~template_ofstream_with_content_based_conditional_update
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_1d0,
             &template_ofstream_with_content_based_conditional_update<char,std::char_traits<char>>::
              VTT);
  std::ios_base::~ios_base(local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p);
  }
  if (local_3e8 != &local_3d8) {
    operator_delete(local_3e8);
  }
  if (local_4d8 != local_4c8) {
    operator_delete(local_4d8);
  }
  return;
}

Assistant:

void t_cpp_generator::generate_service_async_skeleton(t_service* tservice) {
  string svcname = tservice->get_name();

  // Service implementation file includes
  string f_skeleton_name = get_out_dir() + svcname + "_async_server.skeleton.cpp";

  string ns = namespace_prefix(tservice->get_program()->get_namespace("cpp"));

  ofstream_with_content_based_conditional_update f_skeleton;
  f_skeleton.open(f_skeleton_name.c_str());
  f_skeleton << "// This autogenerated skeleton file illustrates one way to adapt a synchronous"
             << endl << "// interface into an asynchronous interface. You should copy it to another"
             << endl
             << "// filename to avoid overwriting it and rewrite as asynchronous any functions"
             << endl << "// that would otherwise introduce unwanted latency." << endl << endl
             << "#include \"" << get_include_prefix(*get_program()) << svcname << ".h\"" << endl
             << "#include <thrift/protocol/TBinaryProtocol.h>" << endl
             << "#include <thrift/async/TAsyncProtocolProcessor.h>" << endl
             << "#include <thrift/async/TEvhttpServer.h>" << endl
             << "#include <event.h>" << endl
             << "#include <evhttp.h>" << endl << endl
             << "using namespace ::apache::thrift;" << endl
             << "using namespace ::apache::thrift::protocol;" << endl
             << "using namespace ::apache::thrift::transport;" << endl
             << "using namespace ::apache::thrift::async;" << endl << endl;

  // the following code would not compile:
  // using namespace ;
  // using namespace ::;
  if ((!ns.empty()) && (ns.compare(" ::") != 0)) {
    f_skeleton << "using namespace " << string(ns, 0, ns.size() - 2) << ";" << endl << endl;
  }

  f_skeleton << "class " << svcname << "Handler : virtual public " << svcname << "If {" << endl
             << " public:" << endl;
  indent_up();
  f_skeleton << indent() << svcname << "Handler() {" << endl << indent()
             << "  // Your initialization goes here" << endl << indent() << "}" << endl << endl;

  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::iterator f_iter;
  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    generate_java_doc(f_skeleton, *f_iter);
    f_skeleton << indent() << function_signature(*f_iter, "") << " {" << endl << indent()
               << "  // Your implementation goes here" << endl << indent() << "  printf(\""
               << (*f_iter)->get_name() << "\\n\");" << endl << indent() << "}" << endl << endl;
  }

  indent_down();
  f_skeleton << "};" << endl << endl;

  f_skeleton << "class " << svcname << "AsyncHandler : "
             << "public " << svcname << "CobSvIf {" << endl << " public:" << endl;
  indent_up();
  f_skeleton << indent() << svcname << "AsyncHandler() {" << endl << indent()
             << "  syncHandler_ = std::unique_ptr<" << svcname << "Handler>(new " << svcname
             << "Handler);" << endl << indent() << "  // Your initialization goes here" << endl
             << indent() << "}" << endl;
  f_skeleton << indent() << "virtual ~" << service_name_ << "AsyncHandler();" << endl;

  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    f_skeleton << endl << indent() << function_signature(*f_iter, "CobSv", "", true) << " {"
               << endl;
    indent_up();

    t_type* returntype = (*f_iter)->get_returntype();
    t_field returnfield(returntype, "_return");

    string target = returntype->is_void() ? "" : "_return";
    if (!returntype->is_void()) {
      f_skeleton << indent() << declare_field(&returnfield, true) << endl;
    }
    generate_function_call(f_skeleton, *f_iter, target, "syncHandler_", "");
    f_skeleton << indent() << "return cob(" << target << ");" << endl;

    scope_down(f_skeleton);
  }
  f_skeleton << endl << " protected:" << endl << indent() << "std::unique_ptr<" << svcname
             << "Handler> syncHandler_;" << endl;
  indent_down();
  f_skeleton << "};" << endl << endl;

  f_skeleton << indent() << "int main(int argc, char **argv) {" << endl;
  indent_up();
  f_skeleton
      << indent() << "int port = 9090;" << endl << indent() << "::std::shared_ptr<" << svcname
      << "AsyncHandler> handler(new " << svcname << "AsyncHandler());" << endl << indent()
      << "::std::shared_ptr<" << svcname << "AsyncProcessor> processor(new " << svcname << "AsyncProcessor(handler));" << endl
      << indent() << "::std::shared_ptr<TProtocolFactory> protocolFactory(new TBinaryProtocolFactory());"
      << endl
      << indent() << "::std::shared_ptr<TAsyncProtocolProcessor> protocolProcessor(new TAsyncProtocolProcessor(processor, protocolFactory));"
      << endl << endl << indent()
      << "TEvhttpServer server(protocolProcessor, port);"
      << endl << indent() << "server.serve();" << endl << indent() << "return 0;" << endl;
  indent_down();
  f_skeleton << "}" << endl << endl;
}